

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void CEditor::ReplaceImage(char *pFileName,int StorageType,void *pUser)

{
  CEditorImage *__dest;
  int iVar1;
  int iVar2;
  IGraphics *pIVar3;
  CEditorImage **ppCVar4;
  CLayerGroup **ppCVar5;
  CLayer **ppCVar6;
  CEditor *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int i;
  CLayerTiles *pLayer;
  int l;
  CLayerGroup *pGroup;
  int g;
  int External;
  CEditorImage *pImg;
  CEditor *pEditor;
  CEditorImage ImgInfo;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffd5c;
  CEditorImage *in_stack_fffffffffffffd60;
  CEditorImage *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int local_21c;
  CEditorImage *in_stack_fffffffffffffde8;
  int local_20c;
  CEditor *in_stack_fffffffffffffdf8;
  int local_200;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  undefined8 local_1a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CEditorImage::CEditorImage
            (in_stack_fffffffffffffd60,
             (CEditor *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  pIVar3 = Graphics(in_RDX);
  iVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[0xe])
                    (pIVar3,&local_1b8,in_RDI,(ulong)in_ESI);
  if (iVar1 != 0) {
    ppCVar4 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                        (&(in_RDX->m_Map).m_lImages,in_RDX->m_SelectedImage);
    __dest = *ppCVar4;
    iVar1 = __dest->m_External;
    pIVar3 = Graphics(in_RDX);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xf])(pIVar3,&__dest->m_Texture);
    if ((__dest->super_CImageInfo).m_pData != (void *)0x0) {
      mem_free((void *)0x1f69d6);
      (__dest->super_CImageInfo).m_pData = (void *)0x0;
    }
    if (__dest->m_pAutoMapper != (IAutoMapper *)0x0) {
      if (__dest->m_pAutoMapper != (IAutoMapper *)0x0) {
        (*__dest->m_pAutoMapper->_vptr_IAutoMapper[1])();
      }
      __dest->m_pAutoMapper = (IAutoMapper *)0x0;
      for (local_200 = 0;
          iVar2 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::size
                            (&(in_RDX->m_Map).m_lGroups), local_200 < iVar2;
          local_200 = local_200 + 1) {
        ppCVar5 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                            (&(in_RDX->m_Map).m_lGroups,local_200);
        in_stack_fffffffffffffdf8 = (CEditor *)*ppCVar5;
        for (local_20c = 0;
            iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size
                              ((array<CLayer_*,_allocator_default<CLayer_*>_> *)
                               &(in_stack_fffffffffffffdf8->super_IEditor).super_IInterface.
                                m_pKernel), local_20c < iVar2; local_20c = local_20c + 1) {
          ppCVar6 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                              ((array<CLayer_*,_allocator_default<CLayer_*>_> *)
                               &(in_stack_fffffffffffffdf8->super_IEditor).super_IInterface.
                                m_pKernel,local_20c);
          if ((*ppCVar6)->m_Type == 2) {
            ppCVar6 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                ((array<CLayer_*,_allocator_default<CLayer_*>_> *)
                                 &(in_stack_fffffffffffffdf8->super_IEditor).super_IInterface.
                                  m_pKernel,local_20c);
            in_stack_fffffffffffffde8 = (CEditorImage *)*ppCVar6;
            if (*(int *)(in_stack_fffffffffffffde8->m_aName + 8) == in_RDX->m_SelectedImage) {
              in_stack_fffffffffffffde8->m_aName[0x48] = '\0';
              in_stack_fffffffffffffde8->m_aName[0x49] = '\0';
              in_stack_fffffffffffffde8->m_aName[0x4a] = '\0';
              in_stack_fffffffffffffde8->m_aName[0x4b] = '\0';
              in_stack_fffffffffffffde8->m_aName[0x4c] = '\0';
            }
          }
        }
      }
    }
    memcpy(__dest,&local_1b8,0x1b0);
    __dest->m_External = iVar1;
    ExtractName((char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    CEditorImage::LoadAutoMapper(in_stack_fffffffffffffde8);
    pIVar3 = Graphics(in_RDX);
    uVar7 = 8;
    iVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
                      (pIVar3,(ulong)local_1b8,(ulong)local_1b4,(ulong)local_1b0,local_1a8,
                       0xffffffff);
    (__dest->m_Texture).m_Id = iVar1;
    local_1a8 = 0;
    SortImages(in_stack_fffffffffffffdf8);
    local_21c = 0;
    while (iVar1 = local_21c,
          iVar2 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                            (&(in_RDX->m_Map).m_lImages), iVar1 < iVar2) {
      in_stack_fffffffffffffd70 =
           (CEditorImage *)
           array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                     (&(in_RDX->m_Map).m_lImages,local_21c);
      iVar1 = str_comp((char *)in_stack_fffffffffffffd60,
                       (char *)CONCAT44(in_stack_fffffffffffffd5c,uVar7));
      if (iVar1 == 0) {
        in_RDX->m_SelectedImage = local_21c;
      }
      local_21c = local_21c + 1;
    }
    in_RDX->m_Dialog = 0;
  }
  CEditorImage::~CEditorImage(in_stack_fffffffffffffd70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::ReplaceImage(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = (CEditor *)pUser;
	CEditorImage ImgInfo(pEditor);
	if(!pEditor->Graphics()->LoadPNG(&ImgInfo, pFileName, StorageType))
		return;

	CEditorImage *pImg = pEditor->m_Map.m_lImages[pEditor->m_SelectedImage];
	int External = pImg->m_External;
	pEditor->Graphics()->UnloadTexture(&(pImg->m_Texture));
	if(pImg->m_pData)
	{
		mem_free(pImg->m_pData);
		pImg->m_pData = 0;
	}
	if(pImg->m_pAutoMapper)
	{
		delete pImg->m_pAutoMapper;
		pImg->m_pAutoMapper = 0;
		for (int g = 0; g < pEditor->m_Map.m_lGroups.size(); g++)
		{
			CLayerGroup *pGroup = pEditor->m_Map.m_lGroups[g];
			for (int l = 0; l < pGroup->m_lLayers.size(); l++)
			{
				if (pGroup->m_lLayers[l]->m_Type == LAYERTYPE_TILES)
				{
					CLayerTiles *pLayer = static_cast<CLayerTiles *>(pGroup->m_lLayers[l]);
					//resets live auto map of affected layers
					if (pLayer->m_Image == pEditor->m_SelectedImage)
					{
						pLayer->m_SelectedRuleSet = 0;
						pLayer->m_LiveAutoMap = false;
					}
				}
			}
		}
	}
	*pImg = ImgInfo;
	pImg->m_External = External;
	pEditor->ExtractName(pFileName, pImg->m_aName, sizeof(pImg->m_aName));
	pImg->LoadAutoMapper();
	pImg->m_Texture = pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
	ImgInfo.m_pData = 0;
	pEditor->SortImages();
	for(int i = 0; i < pEditor->m_Map.m_lImages.size(); ++i)
	{
		if(!str_comp(pEditor->m_Map.m_lImages[i]->m_aName, pImg->m_aName))
			pEditor->m_SelectedImage = i;
	}
	pEditor->m_Dialog = DIALOG_NONE;
}